

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_smpl.c
# Opt level: O0

int ossl_ec_GFp_simple_ladder_step(EC_GROUP *group,EC_POINT *r,EC_POINT *s,EC_POINT *p,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *r_00;
  BIGNUM *r_01;
  BIGNUM *r_02;
  BIGNUM *a;
  BIGNUM *b;
  BIGNUM *r_03;
  BIGNUM *a_00;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  BN_CTX *in_R8;
  BIGNUM *t6;
  BIGNUM *t5;
  BIGNUM *t4;
  BIGNUM *t3;
  BIGNUM *t2;
  BIGNUM *t1;
  BIGNUM *t0;
  int ret;
  int local_2c;
  
  local_2c = 0;
  BN_CTX_start(in_R8);
  r_00 = BN_CTX_get(in_R8);
  r_01 = BN_CTX_get(in_R8);
  r_02 = BN_CTX_get(in_R8);
  a = BN_CTX_get(in_R8);
  b = BN_CTX_get(in_R8);
  r_03 = BN_CTX_get(in_R8);
  a_00 = BN_CTX_get(in_R8);
  if (((((((a_00 != (BIGNUM *)0x0) &&
          (iVar1 = (**(code **)(*in_RDI + 0xf8))
                             (in_RDI,a_00,*(undefined8 *)(in_RSI + 0x10),
                              *(undefined8 *)(in_RDX + 0x10),in_R8), iVar1 != 0)) &&
         (iVar1 = (**(code **)(*in_RDI + 0xf8))
                            (in_RDI,r_00,*(undefined8 *)(in_RSI + 0x20),
                             *(undefined8 *)(in_RDX + 0x20),in_R8), iVar1 != 0)) &&
        ((iVar1 = (**(code **)(*in_RDI + 0xf8))
                            (in_RDI,b,*(undefined8 *)(in_RSI + 0x10),*(undefined8 *)(in_RDX + 0x20),
                             in_R8), iVar1 != 0 &&
         (iVar1 = (**(code **)(*in_RDI + 0xf8))
                            (in_RDI,a,*(undefined8 *)(in_RSI + 0x20),*(undefined8 *)(in_RDX + 0x10),
                             in_R8), iVar1 != 0)))) &&
       ((iVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,r_03,in_RDI[0xc],r_00,in_R8), iVar1 != 0 &&
        ((iVar1 = BN_mod_add_quick(r_03,a_00,r_03,(BIGNUM *)in_RDI[8]), iVar1 != 0 &&
         (iVar1 = BN_mod_add_quick(a_00,a,b,(BIGNUM *)in_RDI[8]), iVar1 != 0)))))) &&
      (iVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,r_03,a_00,r_03,in_R8), iVar1 != 0)) &&
     ((((((iVar1 = (**(code **)(*in_RDI + 0x100))(in_RDI,r_00,r_00,in_R8), iVar1 != 0 &&
          (iVar1 = BN_mod_lshift_quick(r_02,(BIGNUM *)in_RDI[0xd],2,(BIGNUM *)in_RDI[8]), iVar1 != 0
          )) && (iVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,r_00,r_02,r_00,in_R8), iVar1 != 0)) &&
        (((iVar1 = BN_mod_lshift1_quick(r_03,r_03,(BIGNUM *)in_RDI[8]), iVar1 != 0 &&
          (iVar1 = BN_mod_sub_quick(a,b,a,(BIGNUM *)in_RDI[8]), iVar1 != 0)) &&
         ((iVar1 = (**(code **)(*in_RDI + 0x100))(in_RDI,*(undefined8 *)(in_RDX + 0x20),a,in_R8),
          iVar1 != 0 &&
          ((iVar1 = (**(code **)(*in_RDI + 0xf8))
                              (in_RDI,b,*(undefined8 *)(in_RDX + 0x20),
                               *(undefined8 *)(in_RCX + 0x10),in_R8), iVar1 != 0 &&
           (iVar1 = BN_mod_add_quick(r_00,r_00,r_03,(BIGNUM *)in_RDI[8]), iVar1 != 0)))))))) &&
       ((((iVar1 = BN_mod_sub_quick(*(BIGNUM **)(in_RDX + 0x10),r_00,b,(BIGNUM *)in_RDI[8]),
          iVar1 != 0 &&
          (((iVar1 = (**(code **)(*in_RDI + 0x100))(in_RDI,b,*(undefined8 *)(in_RSI + 0x10),in_R8),
            iVar1 != 0 &&
            (iVar1 = (**(code **)(*in_RDI + 0x100))
                               (in_RDI,r_03,*(undefined8 *)(in_RSI + 0x20),in_R8), iVar1 != 0)) &&
           (iVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,a_00,r_03,in_RDI[0xc],in_R8), iVar1 != 0)))
          ) && (((iVar1 = BN_mod_add_quick(r_01,*(BIGNUM **)(in_RSI + 0x10),
                                           *(BIGNUM **)(in_RSI + 0x20),(BIGNUM *)in_RDI[8]),
                 iVar1 != 0 &&
                 (iVar1 = (**(code **)(*in_RDI + 0x100))(in_RDI,r_01,r_01,in_R8), iVar1 != 0)) &&
                (((iVar1 = BN_mod_sub_quick(r_01,r_01,b,(BIGNUM *)in_RDI[8]), iVar1 != 0 &&
                  ((iVar1 = BN_mod_sub_quick(r_01,r_01,r_03,(BIGNUM *)in_RDI[8]), iVar1 != 0 &&
                   (iVar1 = BN_mod_sub_quick(a,b,a_00,(BIGNUM *)in_RDI[8]), iVar1 != 0)))) &&
                 (iVar1 = (**(code **)(*in_RDI + 0x100))(in_RDI,a,a,in_R8), iVar1 != 0)))))) &&
        ((((iVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,r_00,r_03,r_01,in_R8), iVar1 != 0 &&
           (iVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,r_00,r_02,r_00,in_R8), iVar1 != 0)) &&
          (iVar1 = BN_mod_sub_quick(*(BIGNUM **)(in_RSI + 0x10),a,r_00,(BIGNUM *)in_RDI[8]),
          iVar1 != 0)) &&
         ((iVar1 = BN_mod_add_quick(a,b,a_00,(BIGNUM *)in_RDI[8]), iVar1 != 0 &&
          (iVar1 = (**(code **)(*in_RDI + 0x100))(in_RDI,b,r_03,in_R8), iVar1 != 0)))))))) &&
      (((iVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,b,b,r_02,in_R8), iVar1 != 0 &&
        ((iVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,r_01,r_01,a,in_R8), iVar1 != 0 &&
         (iVar1 = BN_mod_lshift1_quick(r_01,r_01,(BIGNUM *)in_RDI[8]), iVar1 != 0)))) &&
       (iVar1 = BN_mod_add_quick(*(BIGNUM **)(in_RSI + 0x20),b,r_01,(BIGNUM *)in_RDI[8]), iVar1 != 0
       )))))) {
    local_2c = 1;
  }
  BN_CTX_end(in_R8);
  return local_2c;
}

Assistant:

int ossl_ec_GFp_simple_ladder_step(const EC_GROUP *group,
                                   EC_POINT *r, EC_POINT *s,
                                   EC_POINT *p, BN_CTX *ctx)
{
    int ret = 0;
    BIGNUM *t0, *t1, *t2, *t3, *t4, *t5, *t6 = NULL;

    BN_CTX_start(ctx);
    t0 = BN_CTX_get(ctx);
    t1 = BN_CTX_get(ctx);
    t2 = BN_CTX_get(ctx);
    t3 = BN_CTX_get(ctx);
    t4 = BN_CTX_get(ctx);
    t5 = BN_CTX_get(ctx);
    t6 = BN_CTX_get(ctx);

    if (t6 == NULL
        || !group->meth->field_mul(group, t6, r->X, s->X, ctx)
        || !group->meth->field_mul(group, t0, r->Z, s->Z, ctx)
        || !group->meth->field_mul(group, t4, r->X, s->Z, ctx)
        || !group->meth->field_mul(group, t3, r->Z, s->X, ctx)
        || !group->meth->field_mul(group, t5, group->a, t0, ctx)
        || !BN_mod_add_quick(t5, t6, t5, group->field)
        || !BN_mod_add_quick(t6, t3, t4, group->field)
        || !group->meth->field_mul(group, t5, t6, t5, ctx)
        || !group->meth->field_sqr(group, t0, t0, ctx)
        || !BN_mod_lshift_quick(t2, group->b, 2, group->field)
        || !group->meth->field_mul(group, t0, t2, t0, ctx)
        || !BN_mod_lshift1_quick(t5, t5, group->field)
        || !BN_mod_sub_quick(t3, t4, t3, group->field)
        /* s->Z coord output */
        || !group->meth->field_sqr(group, s->Z, t3, ctx)
        || !group->meth->field_mul(group, t4, s->Z, p->X, ctx)
        || !BN_mod_add_quick(t0, t0, t5, group->field)
        /* s->X coord output */
        || !BN_mod_sub_quick(s->X, t0, t4, group->field)
        || !group->meth->field_sqr(group, t4, r->X, ctx)
        || !group->meth->field_sqr(group, t5, r->Z, ctx)
        || !group->meth->field_mul(group, t6, t5, group->a, ctx)
        || !BN_mod_add_quick(t1, r->X, r->Z, group->field)
        || !group->meth->field_sqr(group, t1, t1, ctx)
        || !BN_mod_sub_quick(t1, t1, t4, group->field)
        || !BN_mod_sub_quick(t1, t1, t5, group->field)
        || !BN_mod_sub_quick(t3, t4, t6, group->field)
        || !group->meth->field_sqr(group, t3, t3, ctx)
        || !group->meth->field_mul(group, t0, t5, t1, ctx)
        || !group->meth->field_mul(group, t0, t2, t0, ctx)
        /* r->X coord output */
        || !BN_mod_sub_quick(r->X, t3, t0, group->field)
        || !BN_mod_add_quick(t3, t4, t6, group->field)
        || !group->meth->field_sqr(group, t4, t5, ctx)
        || !group->meth->field_mul(group, t4, t4, t2, ctx)
        || !group->meth->field_mul(group, t1, t1, t3, ctx)
        || !BN_mod_lshift1_quick(t1, t1, group->field)
        /* r->Z coord output */
        || !BN_mod_add_quick(r->Z, t4, t1, group->field))
        goto err;

    ret = 1;

 err:
    BN_CTX_end(ctx);
    return ret;
}